

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::ConcurrentAssertionStatementSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0x6b) {
    if ((kind != AssertPropertyStatement) && (kind != AssumePropertyStatement)) {
      return false;
    }
  }
  else if (((1 < kind - CoverPropertyStatement) && (kind != ExpectPropertyStatement)) &&
          (kind != RestrictPropertyStatement)) {
    return false;
  }
  return true;
}

Assistant:

bool ConcurrentAssertionStatementSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AssertPropertyStatement:
        case SyntaxKind::AssumePropertyStatement:
        case SyntaxKind::CoverPropertyStatement:
        case SyntaxKind::CoverSequenceStatement:
        case SyntaxKind::ExpectPropertyStatement:
        case SyntaxKind::RestrictPropertyStatement:
            return true;
        default:
            return false;
    }
}